

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O1

void __thiscall
cinatra::coro_http_client::timer_guard::timer_guard
          (timer_guard *this,coro_http_client *self,duration duration,string *msg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  type local_39;
  Handle local_38;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_30;
  size_type local_28;
  size_type local_20;
  char *pcStack_18;
  
  this->self = self;
  (this->dur_).__r = duration.__r;
  ((self->socket_).
   super___shared_ptr<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  is_timeout_ = false;
  if (-1 < duration.__r) {
    local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(msg->_M_dataplus)._M_p;
    paVar1 = &msg->field_2;
    if (local_30._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar1) {
      local_20 = paVar1->_M_allocated_capacity;
      pcStack_18 = *(char **)((long)&msg->field_2 + 8);
      local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0;
    }
    else {
      local_20 = paVar1->_M_allocated_capacity;
    }
    local_28 = msg->_M_string_length;
    (msg->_M_dataplus)._M_p = (pointer)paVar1;
    msg->_M_string_length = 0;
    (msg->field_2)._M_local_buf[0] = '\0';
    timeout<coro_io::period_timer>
              ((coro_http_client *)&stack0xffffffffffffffc8,(period_timer *)self,
               (duration)&self->timer_,(string *)duration.__r);
    async_simple::coro::detail::LazyBase<bool,_false>::
    start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_press_tool____include_cinatra_coro_http_client_hpp:633:20)>
              ((LazyBase<bool,_false> *)&stack0xffffffffffffffc8,&local_39);
    if (local_38.__handle_ != (void *)0x0) {
      (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_38.__handle_ + 8))->_M_pi)
                ();
      local_38.__handle_ = (void *)0x0;
    }
    if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0)
    {
      operator_delete(local_30._M_pi,local_20 + 1);
    }
  }
  return;
}

Assistant:

timer_guard(coro_http_client *self,
                std::chrono::steady_clock::duration duration, std::string msg)
        : self(self), dur_(duration) {
      self->socket_->is_timeout_ = false;

      if (duration.count() >= 0) {
        self->timeout(self->timer_, duration, std::move(msg))
            .start([](auto &&) {
            });
      }
      return;
    }